

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O2

IterateResult __thiscall
gl3cts::SparseBuffersWithCopyOpsTest::iterate(SparseBuffersWithCopyOpsTest *this)

{
  uchar *puVar1;
  ostringstream *this_00;
  uchar uVar2;
  uchar *puVar3;
  uchar *puVar4;
  uchar *puVar5;
  uchar *puVar6;
  uchar *puVar7;
  uchar *puVar8;
  uchar *puVar9;
  uchar *puVar10;
  uchar *puVar11;
  uchar *puVar12;
  uchar *puVar13;
  uchar *puVar14;
  uchar *puVar15;
  uchar *puVar16;
  uchar *puVar17;
  bool bVar18;
  int iVar19;
  deUint32 dVar20;
  uint uVar21;
  undefined4 extraout_var;
  uchar *puVar23;
  char *pcVar24;
  long lVar25;
  uint n_page;
  uint uVar26;
  int iVar27;
  uint uVar28;
  undefined1 auVar29 [16];
  qpTestResult local_1c4;
  undefined1 local_1b0 [384];
  long lVar22;
  
  iVar19 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar22 = CONCAT44(extraout_var,iVar19);
  bVar18 = glu::ContextInfo::isExtensionSupported
                     (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_sparse_buffer");
  local_1c4 = QP_TEST_RESULT_PASS;
  if (bVar18) {
    bVar18 = glu::ContextInfo::isExtensionSupported
                       (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_buffer_storage");
    if (bVar18) {
      bVar18 = initTest(this);
      pcVar24 = "Fail";
      if (bVar18) {
        puVar1 = this->m_reference_data;
        local_1c4 = QP_TEST_RESULT_FAIL;
        for (uVar28 = 0; uVar28 != 2; uVar28 = uVar28 + 1) {
          for (uVar21 = 0; uVar21 < this->m_n_iterations_to_run; uVar21 = uVar21 + 1) {
            if (uVar21 != 0) {
              (**(code **)(lVar22 + 0x158))(0x8892,0,this->m_page_size * this->m_n_pages_to_test,0);
              dVar20 = (**(code **)(lVar22 + 0x800))();
              glu::checkError(dVar20,"glBufferPageCommitmentARB() call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                              ,0x161b);
            }
            (**(code **)(lVar22 + 0x158))(0x8892,0,(long)this->m_page_size,1);
            dVar20 = (**(code **)(lVar22 + 0x800))();
            glu::checkError(dVar20,"glBufferPageCommitmentARB() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                            ,0x1620);
            (**(code **)(lVar22 + 0x168))(0x8892,0,0x10,puVar1);
            dVar20 = (**(code **)(lVar22 + 0x800))();
            glu::checkError(dVar20,"glBufferSubData() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                            ,0x1624);
            for (uVar26 = 0; uVar26 < this->m_n_pages_to_test; uVar26 = uVar26 + 1) {
              (**(code **)(lVar22 + 0x158))
                        (0x8892,this->m_page_size * uVar26,(long)this->m_page_size,1);
              dVar20 = (**(code **)(lVar22 + 0x800))();
              glu::checkError(dVar20,"glBufferPageCommitmentARB() call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                              ,0x162b);
              for (iVar19 = (uint)(uVar26 == 0) << 4; iVar19 < this->m_page_size;
                  iVar19 = iVar19 + 0x10) {
                iVar27 = this->m_page_size * uVar26;
                if ((uVar28 & 1) == 0) {
                  (**(code **)(lVar22 + 0x308))
                            (0x8892,0x8892,iVar19 + iVar27 + -0x10,iVar19 + iVar27,0x10);
                  dVar20 = (**(code **)(lVar22 + 0x800))();
                  pcVar24 = "glCopyBufferSubData() call failed.";
                  iVar27 = 0x163b;
                }
                else {
                  (**(code **)(lVar22 + 0x168))(0x8892,iVar27 + iVar19,0x10,puVar1);
                  dVar20 = (**(code **)(lVar22 + 0x800))();
                  pcVar24 = "glBufferSubData() call failed.";
                  iVar27 = 0x1644;
                }
                glu::checkError(dVar20,pcVar24,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                                ,iVar27);
              }
            }
            (**(code **)(lVar22 + 0x308))(0x8892,0x8893,0,0,this->m_result_data_storage_size);
            dVar20 = (**(code **)(lVar22 + 0x800))();
            glu::checkError(dVar20,"glCopyBufferSubData() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                            ,0x1653);
            puVar23 = (uchar *)(**(code **)(lVar22 + 0xd00))
                                         (0x8893,0,this->m_n_pages_to_test * this->m_page_size,1);
            dVar20 = (**(code **)(lVar22 + 0x800))();
            glu::checkError(dVar20,"glMapBufferRange() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                            ,0x1659);
            lVar25 = 0x10;
            while( true ) {
              lVar25 = lVar25 + -0x10;
              if ((ulong)(this->m_result_data_storage_size & 0xfffffff0) + lVar25 == 0) break;
              uVar2 = *puVar23;
              puVar3 = puVar23 + 1;
              puVar4 = puVar23 + 2;
              puVar5 = puVar23 + 3;
              puVar6 = puVar23 + 4;
              puVar7 = puVar23 + 5;
              puVar8 = puVar23 + 6;
              puVar9 = puVar23 + 7;
              puVar10 = puVar23 + 8;
              puVar11 = puVar23 + 9;
              puVar12 = puVar23 + 10;
              puVar13 = puVar23 + 0xb;
              puVar14 = puVar23 + 0xc;
              puVar15 = puVar23 + 0xd;
              puVar16 = puVar23 + 0xe;
              puVar17 = puVar23 + 0xf;
              puVar23 = puVar23 + 0x10;
              auVar29[0] = -(uVar2 == *puVar1);
              auVar29[1] = -(*puVar3 == this->m_reference_data[1]);
              auVar29[2] = -(*puVar4 == this->m_reference_data[2]);
              auVar29[3] = -(*puVar5 == this->m_reference_data[3]);
              auVar29[4] = -(*puVar6 == this->m_reference_data[4]);
              auVar29[5] = -(*puVar7 == this->m_reference_data[5]);
              auVar29[6] = -(*puVar8 == this->m_reference_data[6]);
              auVar29[7] = -(*puVar9 == this->m_reference_data[7]);
              auVar29[8] = -(*puVar10 == this->m_reference_data[8]);
              auVar29[9] = -(*puVar11 == this->m_reference_data[9]);
              auVar29[10] = -(*puVar12 == this->m_reference_data[10]);
              auVar29[0xb] = -(*puVar13 == this->m_reference_data[0xb]);
              auVar29[0xc] = -(*puVar14 == this->m_reference_data[0xc]);
              auVar29[0xd] = -(*puVar15 == this->m_reference_data[0xd]);
              auVar29[0xe] = -(*puVar16 == this->m_reference_data[0xe]);
              auVar29[0xf] = -(*puVar17 == this->m_reference_data[0xf]);
              if ((ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe |
                          (ushort)(auVar29[0xf] >> 7) << 0xf) != 0xffff) {
                local_1b0._0_8_ =
                     ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
                this_00 = (ostringstream *)(local_1b0 + 8);
                std::__cxx11::ostringstream::ostringstream(this_00);
                std::operator<<((ostream *)this_00,"Invalid data found for page index [");
                std::ostream::_M_insert<unsigned_long>((ulong)this_00);
                std::operator<<((ostream *)this_00,"], BO data offset:[");
                std::ostream::_M_insert<unsigned_long>((ulong)this_00);
                std::operator<<((ostream *)this_00,"].");
                tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                std::__cxx11::ostringstream::~ostringstream(this_00);
                pcVar24 = "Fail";
                goto LAB_00aeae64;
              }
            }
            (**(code **)(lVar22 + 0x1670))(0x8893);
            dVar20 = (**(code **)(lVar22 + 0x800))();
            glu::checkError(dVar20,"glUnmapBuffer() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                            ,0x1671);
            (**(code **)(lVar22 + 0x168))
                      (0x8893,0,this->m_result_data_storage_size,this->m_clear_buffer);
            dVar20 = (**(code **)(lVar22 + 0x800))();
            glu::checkError(dVar20,"glBufferSubData() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                            ,0x1677);
            (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[5])();
          }
        }
        local_1c4 = QP_TEST_RESULT_PASS;
        pcVar24 = "Pass";
      }
      else {
        local_1c4 = QP_TEST_RESULT_FAIL;
      }
      goto LAB_00aeae64;
    }
  }
  pcVar24 = "Pass";
LAB_00aeae64:
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,local_1c4,pcVar24);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult SparseBuffersWithCopyOpsTest::iterate()
{
	bool result = true;

	/* Execute the test */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Only execute if we're dealing with an OpenGL implementation which supports both:
	 *
	 * 1. GL_ARB_sparse_buffer extension
	 * 2. GL_ARB_buffer_storage extension
	 */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_sparse_buffer") ||
		!m_context.getContextInfo().isExtensionSupported("GL_ARB_buffer_storage"))
	{
		goto end;
	}

	/* Set up the test objects */
	if (!initTest())
	{
		result = false;

		goto end;
	}
	for (unsigned int n_test_case = 0; n_test_case < 2; ++n_test_case)
	{
		for (unsigned int n_iteration = 0; n_iteration < m_n_iterations_to_run; ++n_iteration)
		{
			if (n_iteration != 0)
			{
				gl.bufferPageCommitmentARB(GL_ARRAY_BUFFER, 0, /* offset */
										   m_n_pages_to_test * m_page_size, GL_FALSE);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferPageCommitmentARB() call failed.");
			}

			gl.bufferPageCommitmentARB(GL_ARRAY_BUFFER, 0, /* offset */
									   m_page_size, GL_TRUE);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferPageCommitmentARB() call failed.");

			gl.bufferSubData(GL_ARRAY_BUFFER, 0, /* offset */
							 sizeof(m_reference_data), m_reference_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferSubData() call failed.");

			for (unsigned int n_page = 0; n_page < m_n_pages_to_test; ++n_page)
			{
				/* Try committing pages in a redundant manner. This is a legal behavior in light of
				 * the GL_ARB_sparse_buffer spec */
				gl.bufferPageCommitmentARB(GL_ARRAY_BUFFER, n_page * m_page_size, m_page_size, GL_TRUE);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferPageCommitmentARB() call failed.");

				for (int copy_dst_page_offset = static_cast<int>((n_page == 0) ? sizeof(m_reference_data) : 0);
					 copy_dst_page_offset < static_cast<int>(m_page_size);
					 copy_dst_page_offset += static_cast<int>(sizeof(m_reference_data)))
				{
					const int copy_src_page_offset =
						static_cast<const int>(copy_dst_page_offset - sizeof(m_reference_data));

					switch (n_test_case)
					{
					case 0:
					{
						gl.copyBufferSubData(GL_ARRAY_BUFFER, GL_ARRAY_BUFFER,
											 n_page * m_page_size + copy_src_page_offset,
											 n_page * m_page_size + copy_dst_page_offset, sizeof(m_reference_data));
						GLU_EXPECT_NO_ERROR(gl.getError(), "glCopyBufferSubData() call failed.");

						break;
					}

					case 1:
					{
						gl.bufferSubData(GL_ARRAY_BUFFER, n_page * m_page_size + copy_dst_page_offset,
										 sizeof(m_reference_data), m_reference_data);
						GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferSubData() call failed.");

						break;
					}

					default:
						TCU_FAIL("Unrecognized test case index");
					} /* switch (n_test_case) */
				}	 /* for (all valid destination copy op offsets) */
			}		  /* for (all test pages) */

			/* Copy data from the sparse buffer to a mappable immutable buffer storage */
			gl.copyBufferSubData(GL_ARRAY_BUFFER, GL_ELEMENT_ARRAY_BUFFER, 0, /* readOffset */
								 0,											  /* writeOffset */
								 m_result_data_storage_size);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glCopyBufferSubData() call failed.");

			/* Map the data we have obtained */
			char* mapped_data = (char*)gl.mapBufferRange(GL_ELEMENT_ARRAY_BUFFER, 0, /* offset */
														 m_page_size * m_n_pages_to_test, GL_MAP_READ_BIT);

			GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() call failed.");

			/* Verify the data is valid */
			for (unsigned int n_temp_copy = 0; n_temp_copy < m_result_data_storage_size / sizeof(m_reference_data);
				 ++n_temp_copy)
			{
				const unsigned int cmp_offset = static_cast<const unsigned int>(n_temp_copy * sizeof(m_reference_data));

				if (memcmp(mapped_data + cmp_offset, m_reference_data, sizeof(m_reference_data)) != 0)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << "Invalid data found for page index "
																   "["
									   << (cmp_offset / m_page_size) << "]"
																		", BO data offset:"
																		"["
									   << cmp_offset << "]." << tcu::TestLog::EndMessage;

					result = false;
					goto end;
				}
			} /* for (all datasets) */

			/* Clean up */
			gl.unmapBuffer(GL_ELEMENT_ARRAY_BUFFER);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed.");

			/* Also, zero out the other buffer object we copy the result data to, in case
			 * the glCopyBufferSubData() call does not modify it at all */
			gl.bufferSubData(GL_ELEMENT_ARRAY_BUFFER, 0, /* offset */
							 m_result_data_storage_size, m_clear_buffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferSubData() call failed.");

			/* NOTE: This test passes fine on the misbehaving driver *if* the swapbuffers operation
			 *       issued as a part of the call below is not executed. */
			m_context.getRenderContext().postIterate();
		} /* for (all test iterations) */
	}	 /* for (all test cases) */

end:
	m_testCtx.setTestResult(result ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, result ? "Pass" : "Fail");

	return STOP;
}